

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O2

void __thiscall
TypeOpFloatLess::TypeOpFloatLess(TypeOpFloatLess *this,TypeFactory *t,Translate *trans)

{
  OpBehavior *pOVar1;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"<",&local_39);
  TypeOpBinary::TypeOpBinary
            (&this->super_TypeOpBinary,t,CPUI_FLOAT_LESS,&local_38,TYPE_BOOL,TYPE_FLOAT);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_TypeOpBinary).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_003f4278;
  (this->super_TypeOpBinary).super_TypeOp.opflags = 0x50080;
  pOVar1 = (OpBehavior *)operator_new(0x18);
  pOVar1->opcode = CPUI_FLOAT_LESS;
  pOVar1->isunary = false;
  pOVar1->isspecial = false;
  pOVar1->_vptr_OpBehavior = (_func_int **)&PTR__OpBehavior_003fec48;
  pOVar1[1]._vptr_OpBehavior = (_func_int **)trans;
  (this->super_TypeOpBinary).super_TypeOp.behave = pOVar1;
  return;
}

Assistant:

TypeOpFloatLess::TypeOpFloatLess(TypeFactory *t,const Translate *trans)
  : TypeOpBinary(t,CPUI_FLOAT_LESS,"<",TYPE_BOOL,TYPE_FLOAT)
{
  opflags = PcodeOp::binary | PcodeOp::booloutput | PcodeOp::floatingpoint;
  behave = new OpBehaviorFloatLess(trans);
}